

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  bool bVar1;
  size_t sVar2;
  ImVector<ImGuiTextFilter::ImGuiTextRange> *this_00;
  ImGuiTextRange *pIVar3;
  ImVector<ImGuiTextFilter::ImGuiTextRange> *in_RDI;
  ImVector<ImGuiTextFilter::ImGuiTextRange> *unaff_retaddr;
  char in_stack_0000000f;
  ImGuiTextRange *f;
  ImGuiTextRange *__end1;
  ImGuiTextRange *__begin1;
  ImVector<ImGuiTextFilter::ImGuiTextRange> *__range1;
  ImGuiTextRange input_range;
  int in_stack_ffffffffffffffbc;
  ImGuiTextRange *local_28;
  ImGuiTextRange local_18;
  
  ImVector<ImGuiTextFilter::ImGuiTextRange>::resize(in_RDI,in_stack_ffffffffffffffbc);
  sVar2 = strlen((char *)in_RDI);
  ImGuiTextRange::ImGuiTextRange(&local_18,(char *)in_RDI,(char *)((long)&in_RDI->Size + sVar2));
  ImGuiTextRange::split(f,in_stack_0000000f,unaff_retaddr);
  in_RDI[0x11].Size = 0;
  this_00 = in_RDI + 0x10;
  local_28 = ImVector<ImGuiTextFilter::ImGuiTextRange>::begin(this_00);
  pIVar3 = ImVector<ImGuiTextFilter::ImGuiTextRange>::end(this_00);
  for (; local_28 != pIVar3; local_28 = local_28 + 1) {
    while( true ) {
      bVar1 = false;
      if (local_28->b < local_28->e) {
        bVar1 = ImCharIsBlankA(*local_28->b);
      }
      if (bVar1 == false) break;
      local_28->b = local_28->b + 1;
    }
    while( true ) {
      bVar1 = false;
      if (local_28->b < local_28->e) {
        bVar1 = ImCharIsBlankA(local_28->e[-1]);
      }
      if (bVar1 == false) break;
      local_28->e = local_28->e + -1;
    }
    bVar1 = ImGuiTextRange::empty(local_28);
    if ((!bVar1) && (*local_28->b != '-')) {
      in_RDI[0x11].Size = in_RDI[0x11].Size + 1;
    }
  }
  return;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    ImGuiTextRange input_range(InputBuf, InputBuf + strlen(InputBuf));
    input_range.split(',', &Filters);

    CountGrep = 0;
    for (ImGuiTextRange& f : Filters)
    {
        while (f.b < f.e && ImCharIsBlankA(f.b[0]))
            f.b++;
        while (f.e > f.b && ImCharIsBlankA(f.e[-1]))
            f.e--;
        if (f.empty())
            continue;
        if (f.b[0] != '-')
            CountGrep += 1;
    }
}